

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O2

Node * prvTidyNewLiteralTextNode(Lexer *lexer,ctmbstr txt)

{
  Node *pNVar1;
  
  pNVar1 = prvTidyNewNode(lexer->allocator,lexer);
  pNVar1->start = lexer->lexsize;
  AddStringToLexer(lexer,txt);
  pNVar1->end = lexer->lexsize;
  return pNVar1;
}

Assistant:

Node* TY_(NewLiteralTextNode)( Lexer *lexer, ctmbstr txt )
{
    Node *node = TY_(NewNode)( lexer->allocator, lexer );
    node->start = lexer->lexsize;
    AddStringToLexer( lexer, txt );
    node->end = lexer->lexsize;
    return node;
}